

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_gz.c
# Opt level: O0

void * nhr_gz_write_footer(Bytef *buff,size_t buff_size,size_t writed,void *src_buff,size_t src_size
                          )

{
  undefined8 uVar1;
  uLong *footer;
  size_t src_size_local;
  void *src_buff_local;
  size_t writed_local;
  size_t buff_size_local;
  Bytef *buff_local;
  
  buff_size_local = (size_t)buff;
  if (buff_size - writed < 8) {
    buff_size_local = (size_t)nhr_realloc(buff,buff_size + 8);
  }
  uVar1 = crc32(0,0,0);
  uVar1 = crc32(uVar1,src_buff,src_size & 0xffffffff);
  *(undefined8 *)(buff_size_local + writed) = uVar1;
  ((undefined8 *)(buff_size_local + writed))[1] = src_size;
  return (void *)buff_size_local;
}

Assistant:

static void * nhr_gz_write_footer(Bytef * buff,
								  const size_t buff_size,
								  const size_t writed,
								  const void * src_buff,
								  const size_t src_size) {
	// used `uLong` as unsigned 32 bit integer
	uLong * footer = NULL;
	if (buff_size - writed < NHR_GZ_FOOTER_SIZE) {
		buff = (Bytef *)nhr_realloc(buff, buff_size + NHR_GZ_FOOTER_SIZE);
	}

	footer = (uLong *)(buff + writed);
	*footer++ = crc32(crc32(0L, Z_NULL, 0), src_buff, (uInt)src_size);
	*footer = (uLong)src_size;
	return buff;
}